

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O2

bool __thiscall
Formula_Constraint::Get
          (Formula_Constraint *this,Am_Slot *fetching_slot,Am_Value *value,bool *changed)

{
  Am_Constraint_Context *pAVar1;
  Am_Method_Wrapper *in_value;
  Am_Wrapper *pAVar2;
  Am_Object owner;
  Formula_Context fc;
  Am_Object local_90;
  Am_Value local_88;
  Formula_Context local_78;
  
  Formula_Context::Formula_Context(&local_78,this,fetching_slot,this->depends_on);
  Am_Slot::Get_Owner((Am_Slot *)&local_88);
  Am_Object::Am_Object(&local_90,(Am_Object *)&local_88);
  Am_Object::~Am_Object((Am_Object *)&local_88);
  pAVar1 = Am_Object::cc;
  Am_Object::cc = &local_78.super_Am_Constraint_Context;
  switch(this->type) {
  case F_WRAPPER:
    pAVar2 = (*(this->formula).f_wrapper)(&local_90);
    Am_Value::operator=(value,pAVar2);
    break;
  case F_VOID:
    pAVar2 = (*(this->formula).f_wrapper)(&local_90);
    Am_Value::operator=(value,pAVar2);
    break;
  case F_INT:
    pAVar2 = (*(this->formula).f_wrapper)(&local_90);
    Am_Value::operator=(value,(int)pAVar2);
    break;
  case F_LONG:
    pAVar2 = (*(this->formula).f_wrapper)(&local_90);
    Am_Value::operator=(value,(long)pAVar2);
    break;
  case F_BOOL:
    pAVar2 = (*(this->formula).f_wrapper)(&local_90);
    Am_Value::operator=(value,SUB81(pAVar2,0));
    break;
  case F_FLOAT:
    pAVar2 = (*(this->formula).f_wrapper)(&local_90);
    Am_Value::operator=(value,(float)pAVar2);
    break;
  case F_DOUBLE:
    pAVar2 = (*(this->formula).f_wrapper)(&local_90);
    if (local_78.changed == false) {
      Am_Value::operator=(value,(double)pAVar2);
    }
    break;
  case F_CHAR:
    pAVar2 = (*(this->formula).f_wrapper)(&local_90);
    Am_Value::operator=(value,(char)pAVar2);
    break;
  case F_STRING:
    pAVar2 = (*(this->formula).f_wrapper)(&local_90);
    if (local_78.changed == false) {
      Am_Value::operator=(value,(char *)pAVar2);
    }
    break;
  case F_CONST_STRING:
    pAVar2 = (*(this->formula).f_wrapper)(&local_90);
    if (local_78.changed == false) {
      Am_Value::operator=(value,(char *)pAVar2);
    }
    break;
  case F_PROC:
    pAVar2 = (*(this->formula).f_wrapper)(&local_90);
    Am_Value::operator=(value,(Am_Generic_Procedure *)pAVar2);
    break;
  case F_METHOD:
    in_value = (Am_Method_Wrapper *)(*(this->formula).f_wrapper)(&local_90);
    Am_Value::operator=(value,in_value);
    break;
  case F_VALUE:
    (*(this->formula).f_wrapper)((Am_Object *)&local_88);
    Am_Value::operator=(value,&local_88);
    goto LAB_001d04db;
  case F_CONST_VALUE:
    (*(this->formula).f_wrapper)((Am_Object *)&local_88);
    Am_Value::operator=(value,&local_88);
LAB_001d04db:
    Am_Value::~Am_Value(&local_88);
    if ((value->type & 0x7000) == 0x1000) {
      Am_Value::Set_Empty(value);
    }
  }
  Am_Object::cc = pAVar1;
  Formula_Context::Clean_Up(&local_78,&this->depends_on);
  *changed = local_78.changed;
  if (local_78.inited == false) {
    Am_Value::operator=(value,&local_78.exception);
    Am_Value::Set_Value_Type(value,0x1001);
  }
  Am_Object::~Am_Object(&local_90);
  Formula_Context::~Formula_Context(&local_78);
  return local_78.return_value_from_get;
}

Assistant:

bool
Formula_Constraint::Get(const Am_Slot &fetching_slot, Am_Value &value,
                        bool &changed)
{
  Formula_Context fc(this, fetching_slot, depends_on);

  Am_Object owner = context.Get_Owner();

  Am_PUSH_CC(&fc) switch (type)
  {
  case F_WRAPPER:
    value = formula.f_wrapper(owner);
    break;
  case F_VOID:
    value = formula.f_void(owner);
    break;
  case F_INT:
    value = formula.f_int(owner);
    break;
  case F_LONG:
    value = formula.f_long(owner);
    break;
  case F_BOOL:
    value = formula.f_bool(owner);
    break;
  case F_FLOAT:
    value = formula.f_float(owner);
    break;
  case F_DOUBLE: {
    double hold = formula.f_double(owner);
    if (!fc.changed)
      value = hold;
    break;
  }
  case F_CHAR:
    value = formula.f_char(owner);
    break;
  case F_STRING: {
    const char *hold = formula.f_string(owner);
    if (!fc.changed)
      value = hold;
    break;
  }
  case F_CONST_STRING: {
    const char *hold = formula.f_const_string(owner);
    if (!fc.changed)
      value = hold;
    break;
  }
  case F_PROC:
    value = formula.f_proc(owner);
    break;
  case F_METHOD:
    value = formula.f_method(owner);
    break;
  case F_VALUE:
    value = formula.f_value(owner);
    if (Am_Type_Class(value.type) == Am_ERROR_VALUE_TYPE)
      value.Set_Empty();
    break;
  case F_CONST_VALUE:
    value = formula.f_const_value(owner);
    if (Am_Type_Class(value.type) == Am_ERROR_VALUE_TYPE)
      value.Set_Empty();
    break;
  }
  Am_POP_CC()

      fc.Clean_Up(&depends_on);
  changed = fc.changed;
  if (!fc.inited) {
    value = fc.exception;
    value.Set_Value_Type(Am_FORMULA_INVALID);
  }
  return fc.return_value_from_get;
}